

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O3

void bad_request(int client)

{
  int iVar1;
  char *local_20;
  char *buffer;
  
  local_20 = (char *)0x0;
  iVar1 = asprintf(&local_20,"HTTP/1.0 400 BAD REQUEST\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"Content-type: text/html\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"\r\n");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"<P>Your browser sent a bad request, ");
  send_free(client,&local_20,iVar1);
  iVar1 = asprintf(&local_20,"such as a POST without a Content-Length.\r\n");
  send_free(client,&local_20,iVar1);
  return;
}

Assistant:

void bad_request(int client) {
    char *buffer = NULL;

    int bytes = asprintf(&buffer, "HTTP/1.0 400 BAD REQUEST\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "Content-type: text/html\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<P>Your browser sent a bad request, ");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "such as a POST without a Content-Length.\r\n");
    send_free(client, &buffer, bytes);;
}